

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_x_on_curve_var(secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe c;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  
  secp256k1_fe_sqr(in_stack_ffffffffffffffd0,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  secp256k1_fe_mul(in_stack_ffffffffffffffd0,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (secp256k1_fe *)0x1355b6);
  secp256k1_fe_add_int(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar1 = secp256k1_fe_is_square_var(x);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_on_curve_var(const secp256k1_fe *x) {
    secp256k1_fe c;
    secp256k1_fe_sqr(&c, x);
    secp256k1_fe_mul(&c, &c, x);
    secp256k1_fe_add_int(&c, SECP256K1_B);
    return secp256k1_fe_is_square_var(&c);
}